

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall xray_re::xr_ogf_v3::xr_ogf_v3(xr_ogf_v3 *this)

{
  xr_ogf::xr_ogf(&this->super_xr_ogf,OGF3_VERSION);
  (this->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory =
       (_func_int **)&PTR__xr_ogf_v3_002491f8;
  this->m_vsplits = (ogf3_vsplit *)0x0;
  this->m_fix_faces = (uint16_t *)0x0;
  xr_ibuf::xr_ibuf(&this->m_ib0);
  this->m_ext_vb_index = 0;
  this->m_ext_vb_offset = 0;
  this->m_ext_vb_size = 0;
  (this->m_source)._M_dataplus._M_p = (pointer)&(this->m_source).field_2;
  (this->m_source)._M_string_length = 0;
  (this->m_source).field_2._M_local_buf[0] = '\0';
  (this->m_export_tool)._M_dataplus._M_p = (pointer)&(this->m_export_tool).field_2;
  (this->m_export_tool)._M_string_length = 0;
  (this->m_export_tool).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

xr_ogf_v3::xr_ogf_v3(): xr_ogf(OGF3_VERSION),
	m_vsplits(0), m_fix_faces(0),
	m_ext_vb_index(0), m_ext_vb_offset(0), m_ext_vb_size(0) {}